

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chase.cpp
# Opt level: O0

void __thiscall AStarSolver::addToList(AStarSolver *this,int x,int y,coord origin,int base_score)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  uint *puVar4;
  const_iterator local_60;
  int local_58;
  uint local_54;
  int s;
  int p;
  _Self local_48;
  iterator it;
  iterator iStack_38;
  int score;
  _Self local_30;
  uint local_28;
  int local_24;
  int pos;
  int base_score_local;
  int y_local;
  int x_local;
  AStarSolver *this_local;
  coord origin_local;
  
  if ((((-1 < x) && (x < 0x50)) && (-1 < y)) && (y < 0x20)) {
    pos = y;
    base_score_local = x;
    _y_local = this;
    this_local = (AStarSolver *)origin;
    if (places[x * 0x20 + y].p_ch == '\x18') {
      if ((places[x * 0x20 + y].p_flags & 0x20U) != 0) {
        return;
      }
      local_24 = base_score + 2;
    }
    else {
      local_24 = base_score;
      iVar2 = step_ok((int)places[x * 0x20 + y].p_ch);
      if (iVar2 == 0) {
        return;
      }
    }
    if (places[base_score_local * 0x20 + pos].p_monst != (MonsterThing *)0x0) {
      local_24 = local_24 + 4;
    }
    if (((places[base_score_local * 0x20 + pos].p_item == (ItemThing *)0x0) ||
        ((places[base_score_local * 0x20 + pos].p_item)->type != 8)) ||
       ((places[base_score_local * 0x20 + pos].p_item)->which != 10)) {
      local_28 = base_score_local | pos << 0x10;
      local_30._M_node =
           (_Base_ptr)
           std::
           map<int,_AStarSolver::AStarInfo,_std::less<int>,_std::allocator<std::pair<const_int,_AStarSolver::AStarInfo>_>_>
           ::find(&this->info,(key_type *)&local_28);
      iStack_38 = std::
                  map<int,_AStarSolver::AStarInfo,_std::less<int>,_std::allocator<std::pair<const_int,_AStarSolver::AStarInfo>_>_>
                  ::end(&this->info);
      bVar1 = std::operator!=(&local_30,&stack0xffffffffffffffc8);
      if ((!bVar1) ||
         (pmVar3 = std::
                   map<int,_AStarSolver::AStarInfo,_std::less<int>,_std::allocator<std::pair<const_int,_AStarSolver::AStarInfo>_>_>
                   ::operator[](&this->info,(key_type *)&local_28), local_24 < pmVar3->base_score))
      {
        iVar2 = local_24;
        pmVar3 = std::
                 map<int,_AStarSolver::AStarInfo,_std::less<int>,_std::allocator<std::pair<const_int,_AStarSolver::AStarInfo>_>_>
                 ::operator[](&this->info,(key_type *)&local_28);
        pmVar3->base_score = iVar2;
        pmVar3 = std::
                 map<int,_AStarSolver::AStarInfo,_std::less<int>,_std::allocator<std::pair<const_int,_AStarSolver::AStarInfo>_>_>
                 ::operator[](&this->info,(key_type *)&local_28);
        pmVar3->origin = (coord)this_local;
        iVar2 = heuristicScore(this,base_score_local,pos);
        it._M_node._4_4_ = iVar2 + local_24;
        local_48._M_node =
             (_List_node_base *)
             std::__cxx11::list<int,_std::allocator<int>_>::begin(&this->open_list);
        while( true ) {
          _s = std::__cxx11::list<int,_std::allocator<int>_>::end(&this->open_list);
          bVar1 = std::operator!=(&local_48,(_Self *)&s);
          if (!bVar1) break;
          puVar4 = (uint *)std::_List_iterator<int>::operator*(&local_48);
          local_54 = *puVar4;
          pmVar3 = std::
                   map<int,_AStarSolver::AStarInfo,_std::less<int>,_std::allocator<std::pair<const_int,_AStarSolver::AStarInfo>_>_>
                   ::operator[](&this->info,(key_type *)&local_54);
          iVar2 = pmVar3->base_score;
          local_58 = heuristicScore(this,local_54 & 0xffff,(int)local_54 >> 0x10);
          local_58 = iVar2 + local_58;
          if (it._M_node._4_4_ < local_58) {
            std::_List_const_iterator<int>::_List_const_iterator(&local_60,&local_48);
            std::__cxx11::list<int,_std::allocator<int>_>::insert
                      (&this->open_list,local_60,(value_type_conflict *)&local_28);
            return;
          }
          std::_List_iterator<int>::operator++(&local_48,0);
        }
        std::__cxx11::list<int,_std::allocator<int>_>::push_back
                  (&this->open_list,(value_type_conflict *)&local_28);
      }
    }
  }
  return;
}

Assistant:

void addToList(int x, int y, coord origin, int base_score)
    {
        if (x < 0 || x >= NUMCOLS || y < 0 || y >= NUMLINES)
            return;
        if (char_at(x, y) == CLOSED_DOOR)
        {
            if (flags_at(x, y) & F_LOCKED)
                return;
            base_score += 2;
        }else{
            if (!step_ok(char_at(x, y)))
                return;
        }
        if (monster_at(x, y))
            base_score += 4;
        if (item_at(x, y) && item_at(x, y)->type == SCROLL && item_at(x, y)->which == S_SCARE)
            return;
        int pos = x | y << 16;
        if (info.find(pos) != info.end())
        {
            if (info[pos].base_score <= base_score)
                return;
        }
        info[pos].base_score = base_score;
        info[pos].origin = origin;
        
        int score = heuristicScore(x, y) + base_score;
        for(auto it=open_list.begin(); it != open_list.end(); it++)
        {
            int p = *it;
            int s = info[p].base_score + heuristicScore(p & 0xFFFF, p >> 16);
            if (score < s)
            {
                open_list.insert(it, pos);
                return;
            }
        }
        open_list.push_back(pos);
    }